

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O1

void __thiscall
SphericalTriangleArea_RandomSampling_Test::TestBody(SphericalTriangleArea_RandomSampling_Test *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined8 uVar9;
  byte bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  byte bVar13;
  bool bVar14;
  uint uVar15;
  int iVar16;
  float *__result;
  Ray *pRVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  char *message;
  int iVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  Float FVar28;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  undefined1 auVar56 [16];
  Vector3f a;
  Vector3f b;
  Vector3f c;
  Point3f p0;
  Point3f p1;
  Point3f p2;
  Hammersley2DIter __begin2;
  Float error;
  AssertionResult gtest_ar;
  undefined1 local_1c8 [24];
  aligned_storage_t<sizeof(pbrt::TriangleIntersection),_alignof(pbrt::TriangleIntersection)>
  local_1b0;
  byte local_1a0;
  undefined1 local_198 [16];
  float local_17c;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  AssertHelper local_150;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  Vector3<float> local_120;
  Vector3<float> local_110;
  float local_100;
  float local_fc;
  undefined1 local_f8 [16];
  Tuple3<pbrt::Vector3,_float> local_e8;
  undefined1 local_d8 [16];
  undefined1 local_c0 [12];
  float fStack_b4;
  float fStack_b0;
  float local_ac;
  Float local_a8;
  MediumHandle local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [56];
  
  lVar20 = 0;
  do {
    uVar18 = ((ulong)(lVar20 * 0x7fb5d329728ea185) >> 0x1b ^ lVar20 * 0x7fb5d329728ea185) *
             -0x7e25210b43d22bb3;
    uVar18 = ((uVar18 >> 0x21 ^ uVar18) + 1) * 0x5851f42d4c957f2d + lVar20 * -0x4f5c17a566d501a4 + 1
    ;
    uVar1 = uVar18 * 0x5851f42d4c957f2d + 1 + lVar20 * 2;
    uVar2 = uVar1 * 0x5851f42d4c957f2d + 1 + lVar20 * 2;
    uVar3 = uVar2 * 0x5851f42d4c957f2d + 1 + lVar20 * 2;
    uVar4 = uVar3 * 0x5851f42d4c957f2d + 1 + lVar20 * 2;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar1;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar3;
    auVar23 = vpunpcklqdq_avx(auVar46,auVar25);
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uVar4 * 0x5851f42d4c957f2d + 1 + lVar20 * 2;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar4;
    auVar24 = vpunpcklqdq_avx(auVar47,auVar48);
    auVar43._0_16_ = ZEXT116(0) * auVar23 + ZEXT116(1) * auVar24;
    auVar43._16_16_ = ZEXT116(1) * auVar23;
    auVar6 = vpmovsxbq_avx2(ZEXT416(0x1b2d1b2d));
    auVar44 = vpsrlvq_avx2(auVar43,auVar6);
    auVar7 = vpmovsxbq_avx2(ZEXT416(0x2d1b2d1b));
    auVar8 = vpsrlvq_avx2(auVar43,auVar7);
    auVar23 = vpmovqd_avx512vl(auVar8 ^ auVar44);
    auVar44 = vpsrlq_avx2(auVar43,0x3b);
    auVar24 = vpmovqd_avx512vl(auVar44);
    auVar23 = vprorvd_avx512vl(auVar23,auVar24);
    auVar23 = vcvtudq2ps_avx512vl(auVar23);
    local_168._0_4_ = auVar23._0_4_ * 2.3283064e-10;
    local_168._4_4_ = auVar23._4_4_ * 2.3283064e-10;
    local_168._8_4_ = auVar23._8_4_ * 2.3283064e-10;
    local_168._12_4_ = auVar23._12_4_ * 2.3283064e-10;
    auVar25 = vshufps_avx(local_168,local_168,0xff);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar18;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar2;
    auVar24 = vpunpcklqdq_avx(auVar29,auVar45);
    auVar23 = vpsrlvq_avx2(auVar24,auVar7._0_16_);
    auVar29 = vpsrlvq_avx2(auVar24,auVar6._0_16_);
    auVar23 = vpshufd_avx(auVar23 ^ auVar29,0xe8);
    auVar24 = vpsrlq_avx(auVar24,0x3b);
    auVar24 = vpshufd_avx(auVar24,0xe8);
    auVar23 = vprorvd_avx512vl(auVar23,auVar24);
    auVar23 = vcvtudq2ps_avx512vl(auVar23);
    auVar30._0_4_ = auVar23._0_4_ * 2.3283064e-10;
    auVar30._4_4_ = auVar23._4_4_ * 2.3283064e-10;
    auVar30._8_4_ = auVar23._8_4_ * 2.3283064e-10;
    auVar30._12_4_ = auVar23._12_4_ * 2.3283064e-10;
    auVar23._8_4_ = 0x3f7fffff;
    auVar23._0_8_ = 0x3f7fffff3f7fffff;
    auVar23._12_4_ = 0x3f7fffff;
    auVar23 = vminps_avx512vl(auVar30,auVar23);
    auVar31._8_4_ = 0x3f800000;
    auVar31._0_8_ = 0x3f8000003f800000;
    auVar31._12_4_ = 0x3f800000;
    auVar24._8_4_ = 0xc0000000;
    auVar24._0_8_ = 0xc0000000c0000000;
    auVar24._12_4_ = 0xc0000000;
    local_138 = vfmadd132ps_avx512vl(auVar23,auVar31,auVar24);
    auVar23 = vfnmadd213ss_fma(local_138,local_138,ZEXT416(0x3f800000));
    auVar23 = vmaxss_avx(auVar23,ZEXT816(0) << 0x20);
    if (auVar23._0_4_ < 0.0) {
      fVar26 = sqrtf(auVar23._0_4_);
    }
    else {
      auVar23 = vsqrtss_avx(auVar23,auVar23);
      fVar26 = auVar23._0_4_;
    }
    local_148._0_4_ = fVar26;
    auVar32._8_4_ = 0x3f7fffff;
    auVar32._0_8_ = 0x3f7fffff3f7fffff;
    auVar32._12_4_ = 0x3f7fffff;
    uVar18 = vcmpps_avx512vl(local_168,auVar32,1);
    bVar10 = (byte)(uVar18 >> 3);
    uVar9 = vcmpps_avx512vl(local_168,auVar32,1);
    local_178._0_2_ = (short)uVar9;
    fVar22 = (float)((uint)(bVar10 & 1) * (int)(auVar25._0_4_ * 6.2831855) +
                    (uint)!(bool)(bVar10 & 1) * 0x40c90fda);
    fVar26 = cosf(fVar22);
    fVar26 = fVar26 * (float)local_148._0_4_;
    fVar22 = sinf(fVar22);
    auVar23 = vinsertps_avx(ZEXT416((uint)fVar26),ZEXT416((uint)(fVar22 * (float)local_148._0_4_)),
                            0x10);
    local_110.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar23);
    local_110.super_Tuple3<pbrt::Vector3,_float>.z = local_138._0_4_;
    auVar24 = vpermilpd_avx(local_168,1);
    local_148 = vmovshdup_avx(local_138);
    auVar23 = vfnmadd213ss_fma(local_148,local_148,ZEXT416(0x3f800000));
    auVar23 = vmaxss_avx(auVar23,ZEXT816(0) << 0x20);
    if (auVar23._0_4_ < 0.0) {
      fVar26 = sqrtf(auVar23._0_4_);
    }
    else {
      auVar23 = vsqrtss_avx(auVar23,auVar23);
      fVar26 = auVar23._0_4_;
    }
    bVar10 = local_178[0] >> 2;
    auVar11._8_4_ = 0x3f7fffff;
    auVar11._0_8_ = 0x3f7fffff3f7fffff;
    auVar11._12_4_ = 0x3f7fffff;
    uVar18 = vcmpps_avx512vl(local_168,auVar11,1);
    local_178._0_4_ = (int)uVar18;
    bVar13 = (byte)(uVar18 >> 1);
    fVar22 = (float)((uint)(bVar10 & 1) * (int)(auVar24._0_4_ * 6.2831855) +
                    (uint)!(bool)(bVar10 & 1) * 0x40c90fda);
    local_198 = ZEXT416((uint)fVar22);
    fVar22 = cosf(fVar22);
    local_f8 = ZEXT416((uint)(fVar22 * fVar26));
    fVar22 = sinf((float)local_198._0_4_);
    auVar23 = vinsertps_avx(local_f8,ZEXT416((uint)(fVar22 * fVar26)),0x10);
    local_120.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar23);
    local_120.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_148._0_4_;
    auVar23 = vmovshdup_avx(local_168);
    fVar26 = local_168._0_4_;
    local_168 = vfmadd132ss_fma(ZEXT416((uint)(bVar13 & 1) * auVar23._0_4_ +
                                        (uint)!(bool)(bVar13 & 1) * 0x3f7fffff),
                                SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000));
    auVar23 = vfnmadd213ss_fma(local_168,local_168,SUB6416(ZEXT464(0x3f800000),0));
    auVar23 = vmaxss_avx(auVar23,ZEXT816(0));
    if (auVar23._0_4_ < 0.0) {
      fVar22 = sqrtf(auVar23._0_4_);
    }
    else {
      auVar23 = vsqrtss_avx(auVar23,auVar23);
      fVar22 = auVar23._0_4_;
    }
    fVar26 = (float)((uint)(local_178[0] & 1) * (int)(fVar26 * 6.2831855) +
                    (uint)!(bool)(local_178[0] & 1) * 0x40c90fda);
    fVar27 = cosf(fVar26);
    local_178 = ZEXT416((uint)(fVar27 * fVar22));
    fVar26 = sinf(fVar26);
    local_f8 = vinsertps_avx(local_178,ZEXT416((uint)(fVar26 * fVar22)),0x10);
    local_e8._0_8_ = vmovlps_avx(local_f8);
    local_e8.z = (float)local_168._0_4_;
    fVar22 = (float)local_148._0_4_ + (float)local_138._0_4_ + (float)local_168._0_4_;
    local_1c8._8_8_ = 0;
    local_1c8._0_4_ = local_120.super_Tuple3<pbrt::Vector3,_float>.x;
    local_1c8._4_4_ = local_120.super_Tuple3<pbrt::Vector3,_float>.y;
    local_178._8_8_ = 0;
    local_178._0_4_ = local_110.super_Tuple3<pbrt::Vector3,_float>.x;
    local_178._4_4_ = local_110.super_Tuple3<pbrt::Vector3,_float>.y;
    fVar26 = local_120.super_Tuple3<pbrt::Vector3,_float>.y;
    local_198._0_4_ =
         local_110.super_Tuple3<pbrt::Vector3,_float>.x +
         local_120.super_Tuple3<pbrt::Vector3,_float>.x + local_f8._0_4_;
    local_198._4_4_ = local_110.super_Tuple3<pbrt::Vector3,_float>.y + fVar26 + local_f8._4_4_;
    local_198._8_4_ = local_f8._8_4_ + 0.0;
    local_198._12_4_ = local_f8._12_4_ + 0.0;
    auVar41._0_4_ = (float)local_198._0_4_ * (float)local_198._0_4_;
    auVar41._4_4_ = (float)local_198._4_4_ * (float)local_198._4_4_;
    auVar41._8_4_ = (float)local_198._8_4_ * (float)local_198._8_4_;
    auVar41._12_4_ = (float)local_198._12_4_ * (float)local_198._12_4_;
    auVar23 = vhaddps_avx(auVar41,auVar41);
    fVar27 = fVar22 * fVar22 + auVar23._0_4_;
    if (fVar27 < 0.0) {
      fVar27 = sqrtf(fVar27);
    }
    else {
      auVar23 = vsqrtss_avx(ZEXT416((uint)fVar27),ZEXT416((uint)fVar27));
      fVar27 = auVar23._0_4_;
    }
    auVar42._4_4_ = fVar27;
    auVar42._0_4_ = fVar27;
    auVar42._8_4_ = fVar27;
    auVar42._12_4_ = fVar27;
    _local_88 = vdivps_avx(local_198,auVar42);
    local_48 = vmovshdup_avx(_local_88);
    fVar22 = fVar22 / fVar27;
    local_58 = ZEXT416((uint)fVar22);
    auVar52._4_4_ = fVar22;
    auVar52._0_4_ = fVar22;
    auVar52._8_4_ = fVar22;
    auVar52._12_4_ = fVar22;
    auVar49._8_4_ = 0x3f800000;
    auVar49._0_8_ = 0x3f8000003f800000;
    auVar49._12_4_ = 0x3f800000;
    auVar51._8_4_ = 0x80000000;
    auVar51._0_8_ = 0x8000000080000000;
    auVar51._12_4_ = 0x80000000;
    auVar25 = vpternlogd_avx512vl(auVar49,auVar52,auVar51,0xf8);
    fVar27 = auVar25._0_4_;
    fVar22 = -1.0 / (fVar22 + fVar27);
    fVar55 = local_48._0_4_;
    local_100 = local_88._0_4_;
    auVar24 = vfmadd213ss_fma(ZEXT416((uint)(local_100 * local_100 * fVar27)),ZEXT416((uint)fVar22),
                              auVar49);
    auVar23 = vinsertps_avx(local_1c8._0_16_,local_178,0x4c);
    auVar54._0_4_ = fVar55 * auVar23._0_4_;
    auVar54._4_4_ = local_48._4_4_ * auVar23._4_4_;
    auVar54._8_4_ = local_48._8_4_ * auVar23._8_4_;
    auVar54._12_4_ = local_48._12_4_ * auVar23._12_4_;
    auVar23 = vinsertps_avx(local_178,local_1c8._0_16_,0x1c);
    auVar56._4_4_ = local_100;
    auVar56._0_4_ = local_100;
    auVar56._8_4_ = local_100;
    auVar56._12_4_ = local_100;
    auVar23 = vfmadd213ps_fma(auVar56,auVar23,auVar54);
    auVar23 = vfmadd213ps_fma(local_138,auVar52,auVar23);
    uVar9 = vmovlps_avx(auVar23);
    local_c0._0_4_ = (float)uVar9;
    local_c0._4_4_ = SUB84(uVar9,4);
    auVar53._0_4_ = local_100 * local_f8._0_4_;
    auVar53._4_4_ = local_88._4_4_ * local_f8._4_4_;
    auVar53._8_4_ = local_88._8_4_ * local_f8._8_4_;
    auVar53._12_4_ = local_88._12_4_ * local_f8._12_4_;
    auVar23 = vmovshdup_avx(auVar53);
    auVar23 = vfmadd231ss_fma(auVar23,local_f8,_local_88);
    auVar23 = vfmadd231ss_fma(auVar23,local_58,ZEXT416((uint)local_168._0_4_));
    local_c0._8_4_ = auVar23._0_4_;
    lVar19 = 4;
    pRVar17 = (Ray *)local_c0;
    do {
      if (*(float *)(local_c0 + lVar19) < (pRVar17->o).super_Tuple3<pbrt::Point3,_float>.x) {
        pRVar17 = (Ray *)(local_c0 + lVar19);
      }
      lVar19 = lVar19 + 4;
    } while (lVar19 != 0xc);
    fVar5 = local_100 * fVar55 * fVar22;
    local_d8 = ZEXT416((uint)fVar5);
    local_198 = ZEXT416((uint)(fVar27 * fVar5));
    local_100 = -fVar27 * local_100;
    auVar23 = vfmadd213ss_fma(ZEXT416((uint)(fVar55 * fVar55)),ZEXT416((uint)fVar22),auVar25);
    _local_68 = vinsertps_avx(auVar23,auVar24,0x10);
    local_17c = (pRVar17->o).super_Tuple3<pbrt::Point3,_float>.x;
    a.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_138._0_4_;
    a.super_Tuple3<pbrt::Vector3,_float>.x = local_110.super_Tuple3<pbrt::Vector3,_float>.x;
    a.super_Tuple3<pbrt::Vector3,_float>.y = local_110.super_Tuple3<pbrt::Vector3,_float>.y;
    b.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_148._0_4_;
    b.super_Tuple3<pbrt::Vector3,_float>.x = local_120.super_Tuple3<pbrt::Vector3,_float>.x;
    b.super_Tuple3<pbrt::Vector3,_float>.y = local_120.super_Tuple3<pbrt::Vector3,_float>.y;
    c.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_168._0_4_;
    c.super_Tuple3<pbrt::Vector3,_float>.x = local_e8.x;
    c.super_Tuple3<pbrt::Vector3,_float>.y = local_e8.y;
    FVar28 = pbrt::SphericalTriangleArea(a,b,c);
    local_150.data_ = (AssertHelperData *)0x9c4000000000;
    local_178._0_4_ = local_110.super_Tuple3<pbrt::Vector3,_float>.x;
    fVar22 = local_120.super_Tuple3<pbrt::Vector3,_float>.x;
    local_f8._0_4_ = local_e8.x;
    _local_78 = vinsertps_avx(local_d8,ZEXT416((uint)local_198._0_4_),0x10);
    iVar21 = 0;
    do {
      auVar36._0_8_ = pbrt::detail::Hammersley2DIter::operator*((Hammersley2DIter *)&local_150);
      auVar36._8_56_ = extraout_var_03;
      auVar24 = auVar36._0_16_;
      auVar23 = vmovshdup_avx(auVar24);
      fVar27 = auVar23._0_4_;
      if (FVar28 <= 3.1415927) {
        auVar24 = vfmadd231ss_fma(ZEXT416((uint)(1.0 - auVar36._0_4_)),auVar24,
                                  ZEXT416((uint)local_17c));
        local_d8._0_4_ = auVar24._0_4_;
        auVar24 = vmaxss_avx(ZEXT416((uint)(1.0 - (float)local_d8._0_4_ * (float)local_d8._0_4_)),
                             ZEXT816(0));
        if (auVar24._0_4_ < 0.0) {
          local_198 = auVar23;
          auVar39._0_4_ = sqrtf(auVar24._0_4_);
          auVar39._4_60_ = extraout_var_01;
          auVar23 = auVar39._0_16_;
          fVar27 = local_198._0_4_;
        }
        else {
          auVar23 = vsqrtss_avx(auVar24,auVar24);
        }
        fVar27 = (fVar27 + fVar27) * 3.1415927;
        auVar24 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar23);
        uVar9 = vcmpss_avx512f(auVar23,SUB6416(ZEXT464(0xbf800000),0),1);
        bVar14 = (bool)((byte)uVar9 & 1);
        local_198._4_12_ = auVar24._4_12_;
        local_198._0_4_ = (uint)bVar14 * -0x40800000 + (uint)!bVar14 * auVar24._0_4_;
        local_98._0_4_ = cosf(fVar27);
        local_98._4_4_ = extraout_XMM0_Db_00;
        local_98._8_4_ = extraout_XMM0_Dc_00;
        local_98._12_4_ = extraout_XMM0_Dd_00;
        auVar40._0_4_ = sinf(fVar27);
        auVar40._4_60_ = extraout_var_02;
        auVar23 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)local_d8._0_4_));
        uVar9 = vcmpss_avx512f(ZEXT416((uint)local_d8._0_4_),SUB6416(ZEXT464(0xbf800000),0),1);
        bVar14 = (bool)((byte)uVar9 & 1);
        fVar27 = (float)((uint)bVar14 * -0x40800000 + (uint)!bVar14 * auVar23._0_4_);
        auVar23 = vinsertps_avx(auVar40._0_16_,ZEXT416((uint)local_98._0_4_),0x10);
        auVar34._0_4_ = auVar23._0_4_ * (float)local_198._0_4_;
        auVar34._4_4_ = auVar23._4_4_ * (float)local_198._0_4_;
        auVar34._8_4_ = auVar23._8_4_ * (float)local_198._0_4_;
        auVar34._12_4_ = auVar23._12_4_ * (float)local_198._0_4_;
        auVar23 = vmovshdup_avx(auVar34);
        auVar50._0_4_ = auVar34._0_4_ * (float)local_68._0_4_;
        auVar50._4_4_ = auVar34._4_4_ * (float)local_68._4_4_;
        auVar50._8_4_ = auVar34._8_4_ * fStack_60;
        auVar50._12_4_ = auVar34._12_4_ * fStack_5c;
        auVar24 = vshufps_avx(auVar50,auVar50,0xe1);
        auVar33._0_4_ =
             fVar27 * (float)local_88._0_4_ + auVar34._0_4_ * (float)local_78._0_4_ + auVar24._0_4_;
        auVar33._4_4_ =
             fVar27 * (float)local_88._4_4_ + auVar34._4_4_ * (float)local_78._4_4_ + auVar24._4_4_;
        auVar33._8_4_ = fVar27 * fStack_80 + auVar34._8_4_ * fStack_70 + auVar24._8_4_;
        auVar33._12_4_ = fVar27 * fStack_7c + auVar34._12_4_ * fStack_6c + auVar24._12_4_;
        local_ac = fVar27 * (float)local_58._0_4_ +
                   (auVar23._0_4_ * local_100 - auVar34._0_4_ * (float)local_48._0_4_);
      }
      else {
        auVar24 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar24,ZEXT416(0xc0000000));
        local_d8._0_4_ = auVar24._0_4_;
        auVar24 = vfnmadd213ss_fma(auVar24,auVar24,SUB6416(ZEXT464(0x3f800000),0));
        auVar24 = vmaxss_avx(auVar24,ZEXT816(0));
        if (auVar24._0_4_ < 0.0) {
          local_198 = auVar23;
          auVar37._0_4_ = sqrtf(auVar24._0_4_);
          auVar37._4_60_ = extraout_var;
          local_98 = auVar37._0_16_;
          fVar27 = local_198._0_4_;
        }
        else {
          local_98 = vsqrtss_avx(auVar24,auVar24);
        }
        local_198._0_4_ = cosf(fVar27 * 6.2831855);
        local_198._4_4_ = extraout_XMM0_Db;
        local_198._8_4_ = extraout_XMM0_Dc;
        local_198._12_4_ = extraout_XMM0_Dd;
        auVar38._0_4_ = sinf(fVar27 * 6.2831855);
        auVar38._4_60_ = extraout_var_00;
        auVar23 = vinsertps_avx(local_198,auVar38._0_16_,0x10);
        auVar33._0_4_ = (float)local_98._0_4_ * auVar23._0_4_;
        auVar33._4_4_ = (float)local_98._0_4_ * auVar23._4_4_;
        auVar33._8_4_ = (float)local_98._0_4_ * auVar23._8_4_;
        auVar33._12_4_ = (float)local_98._0_4_ * auVar23._12_4_;
        local_ac = (float)local_d8._0_4_;
      }
      auVar24 = local_f8;
      auVar23 = local_178;
      local_c0._0_4_ = 0.0;
      local_c0._4_4_ = 0.0;
      local_c0._8_4_ = 0.0;
      uVar9 = vmovlps_avx(auVar33);
      fStack_b4 = (float)uVar9;
      fStack_b0 = (float)((ulong)uVar9 >> 0x20);
      local_a8 = 0.0;
      local_a0.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
               )0;
      p0.super_Tuple3<pbrt::Point3,_float>.z = (float)local_138._0_4_;
      p0.super_Tuple3<pbrt::Point3,_float>.x = (float)local_178._0_4_;
      p0.super_Tuple3<pbrt::Point3,_float>.y = (float)local_178._4_4_;
      p1.super_Tuple3<pbrt::Point3,_float>.z = (float)local_148._0_4_;
      p1.super_Tuple3<pbrt::Point3,_float>.x = fVar22;
      p1.super_Tuple3<pbrt::Point3,_float>.y = fVar26;
      p2.super_Tuple3<pbrt::Point3,_float>.z = (float)local_168._0_4_;
      p2.super_Tuple3<pbrt::Point3,_float>.x = (float)local_f8._0_4_;
      p2.super_Tuple3<pbrt::Point3,_float>.y = (float)local_f8._4_4_;
      local_178 = auVar23;
      local_f8 = auVar24;
      pbrt::IntersectTriangle
                ((optional<pbrt::TriangleIntersection> *)&local_1b0.__align,(Ray *)local_c0,INFINITY
                 ,p0,p1,p2);
      uVar15 = (uint)local_1a0;
      if (uVar15 == 1) {
        local_1a0 = 0;
      }
      iVar21 = iVar21 + uVar15;
      iVar16 = (int)local_150.data_ + 1;
      local_150.data_._0_4_ = iVar16;
    } while (iVar16 != 40000);
    uVar9 = vcmpss_avx512f(ZEXT416((uint)FVar28),ZEXT416(0x40490fdb),0xe);
    bVar14 = (bool)((byte)uVar9 & 1);
    fVar26 = (float)iVar21 /
             (float)((uint)bVar14 * 0x4546f194 +
                    (uint)!bVar14 * (int)((1.0 / ((1.0 - local_17c) * 6.2831855)) * 40000.0));
    local_138._0_4_ = fVar26;
    auVar35._0_4_ = (fVar26 - FVar28) / FVar28;
    auVar35._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar12._8_4_ = 0x7fffffff;
    auVar12._0_8_ = 0x7fffffff7fffffff;
    auVar12._12_4_ = 0x7fffffff;
    auVar23 = vandps_avx512vl(auVar35,auVar12);
    local_fc = auVar23._0_4_;
    local_1b0.__align = (anon_struct_4_0_00000001_for___align)0x3d0f5c29;
    testing::internal::CmpHelperLT<float,float>
              ((internal *)local_c0,"error","0.035f",&local_fc,(float *)&local_1b0.__align);
    if (local_c0[0] == '\0') {
      testing::Message::Message((Message *)&local_1b0.__align);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0._0_8_ + 0x10),"Area ",5);
      std::ostream::_M_insert<double>((double)FVar28);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0._0_8_ + 0x10),", estimate ",0xb);
      std::ostream::_M_insert<double>((double)(float)local_138._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0._0_8_ + 0x10),", va = ",7);
      pbrt::operator<<((ostream *)(local_1b0._0_8_ + 0x10),&local_110);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0._0_8_ + 0x10),", vb = ",7);
      pbrt::operator<<((ostream *)(local_1b0._0_8_ + 0x10),&local_120);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0._0_8_ + 0x10),", vc = ",7);
      pbrt::operator<<((ostream *)(local_1b0._0_8_ + 0x10),(Vector3<float> *)&local_e8);
      message = "";
      if ((undefined8 *)CONCAT44(fStack_b4,local_c0._8_4_) != (undefined8 *)0x0) {
        message = *(char **)CONCAT44(fStack_b4,local_c0._8_4_);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
                 ,0x227,message);
      testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_1b0.__align);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      if ((long *)local_1b0._0_8_ != (long *)0x0) {
        bVar14 = testing::internal::IsTrue(true);
        if ((bVar14) && ((long *)local_1b0._0_8_ != (long *)0x0)) {
          (**(code **)(*(long *)local_1b0._0_8_ + 8))();
        }
        local_1b0._0_8_ = (long *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_c0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    lVar20 = lVar20 + 1;
  } while (lVar20 != 100);
  return;
}

Assistant:

TEST(SphericalTriangleArea, RandomSampling) {
    for (int i = 0; i < 100; ++i) {
        RNG rng(i);
        Vector3f a = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
        Vector3f b = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
        Vector3f c = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});

        Vector3f axis = Normalize(a + b + c);
        Frame frame = Frame::FromZ(axis);
        Float cosTheta = std::min({Dot(a, axis), Dot(b, axis), Dot(c, axis)});

        Float area = SphericalTriangleArea(a, b, c);
        bool sampleSphere = area > Pi;
        int sqrtN = 200;
        int count = 0;
        for (Point2f u : Hammersley2D(sqrtN * sqrtN)) {
            Vector3f v;
            if (sampleSphere)
                v = SampleUniformSphere(u);
            else {
                v = SampleUniformCone(u, cosTheta);
                v = frame.FromLocal(v);
            }

            if (IntersectTriangle(Ray(Point3f(0, 0, 0), v), Infinity, Point3f(a),
                                  Point3f(b), Point3f(c)))
                ++count;
        }

        Float pdf = sampleSphere ? UniformSpherePDF() : UniformConePDF(cosTheta);
        Float estA = Float(count) / (sqrtN * sqrtN * pdf);

        Float error = std::abs((estA - area) / area);
        EXPECT_LT(error, 0.035f) << "Area " << area << ", estimate " << estA
                                 << ", va = " << a << ", vb = " << b << ", vc = " << c;
    }
}